

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPrimal.cpp
# Opt level: O1

void __thiscall HPrimal::primalRebuild(HPrimal *this)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  HModel *pHVar4;
  __time_t _Var5;
  __suseconds_t _Var6;
  uint uVar7;
  timeval tv;
  timeval local_38;
  
  HModel::recordPivots(this->model,-1,-1,0.0);
  pHVar4 = this->model;
  gettimeofday(&local_38,(__timezone_ptr_t)0x0);
  _Var6 = local_38.tv_usec;
  _Var5 = local_38.tv_sec;
  dVar1 = (pHVar4->timer).startTime;
  uVar3 = this->invertHint;
  this->invertHint = 0;
  pHVar4 = this->model;
  if (((uVar3 != 3 | pHVar4->InvertIfRowOutNeg) == 1) && (0 < pHVar4->countUpdate)) {
    HModel::computeFactor(pHVar4);
    this->countUpdate = 0;
  }
  HModel::computeDual(this->model);
  HModel::computePrimal(this->model);
  HModel::computeDuObj(this->model,2);
  HModel::util_reportNumberIterationObjectiveValue(this->model);
  pHVar4 = this->model;
  gettimeofday(&local_38,(__timezone_ptr_t)0x0);
  dVar2 = (pHVar4->timer).startTime;
  uVar7 = this->totalRebuilds + 1;
  this->totalRebuilds = uVar7;
  this->totalRebuildTime =
       this->totalRebuildTime +
       (((double)local_38.tv_usec / 1000000.0 + (double)local_38.tv_sec) - dVar2) +
       (dVar1 - ((double)_Var5 + (double)_Var6 / 1000000.0));
  printf("Primal     rebuild %d (%1d) on iteration %9d: Rebuild time = %g; Total rebuild time %g\n",
         (ulong)uVar7,(ulong)uVar3,(ulong)(uint)this->model->numberIteration);
  this->model->mlFg_haveFreshRebuild = 1;
  return;
}

Assistant:

void HPrimal::primalRebuild() {
    model->recordPivots(-1, -1, 0); // Indicate REINVERT
#ifdef JAJH_dev
    //    double tt0 = model->timer.getTime();
#endif
    double tt0 = model->timer.getTime();

    // Rebuild model->factor - only if we got updates
    int sv_invertHint = invertHint;
    invertHint = invertHint_no; // Was 0
    // Possibly Rebuild model->factor
    bool reInvert = model->countUpdate > 0;
    if (!model->InvertIfRowOutNeg) {
      // Don't reinvert if rowOut is negative [equivalently, if sv_invertHint == invertHint_possiblyOptimal]
      if (sv_invertHint == invertHint_possiblyOptimal) {
	assert(columnIn == -1);
	reInvert = false;
      }
    }
    if (reInvert) {
        model->computeFactor();
        countUpdate = 0;
    }
    model->computeDual();
    model->computePrimal();
    model->computeDuObj();
    model->util_reportNumberIterationObjectiveValue();

    double rebuildTime = model->timer.getTime()-tt0;
    totalRebuilds++;
    totalRebuildTime += rebuildTime;
#ifdef JAJH_dev
    printf("Primal     rebuild %d (%1d) on iteration %9d: Rebuild time = %g; Total rebuild time %g\n",
	   totalRebuilds, sv_invertHint, model->numberIteration, rebuildTime, totalRebuildTime);
#endif
    //Data are fresh from rebuild
    model->mlFg_haveFreshRebuild = 1;
}